

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2closest_edge_query_base.h
# Opt level: O2

void __thiscall
S2ClosestEdgeQueryBase<S2MinDistance>::FindClosestEdgesBruteForce
          (S2ClosestEdgeQueryBase<S2MinDistance> *this)

{
  S2ShapeIndex *pSVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  int edge_id;
  ShapeIterator it;
  ShapeIterator local_40;
  S2Shape *shape;
  
  pSVar1 = this->index_;
  local_40.shape_id_ = 0;
  local_40.index_ = pSVar1;
  iVar3 = (*pSVar1->_vptr_S2ShapeIndex[2])(pSVar1);
  while( true ) {
    it.shape_id_ = iVar3;
    it.index_ = pSVar1;
    it._12_4_ = 0;
    bVar2 = S2ShapeIndex::ShapeIterator::operator!=(&local_40,it);
    if (!bVar2) break;
    iVar4 = (*(local_40.index_)->_vptr_S2ShapeIndex[3])
                      (local_40.index_,(ulong)(uint)local_40.shape_id_);
    shape = (S2Shape *)CONCAT44(extraout_var,iVar4);
    if (shape != (S2Shape *)0x0) {
      iVar4 = (*shape->_vptr_S2Shape[2])(shape);
      edge_id = 0;
      if (iVar4 < 1) {
        iVar4 = edge_id;
      }
      for (; iVar4 != edge_id; edge_id = edge_id + 1) {
        MaybeAddResult(this,shape,edge_id);
      }
    }
    local_40.shape_id_ = local_40.shape_id_ + 1;
  }
  return;
}

Assistant:

void S2ClosestEdgeQueryBase<Distance>::FindClosestEdgesBruteForce() {
  for (S2Shape* shape : *index_) {
    if (shape == nullptr) continue;
    int num_edges = shape->num_edges();
    for (int e = 0; e < num_edges; ++e) {
      MaybeAddResult(*shape, e);
    }
  }
}